

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

bool __thiscall
crnlib::dynamic_string::ensure_buf(dynamic_string *this,uint len,bool preserve_contents)

{
  ushort uVar1;
  uint new_buf_size;
  
  new_buf_size = len + 1;
  uVar1 = this->m_buf_size;
  if (uVar1 < new_buf_size && new_buf_size < 0x10000) {
    expand_buf(this,new_buf_size,preserve_contents);
    uVar1 = this->m_buf_size;
  }
  return new_buf_size <= uVar1;
}

Assistant:

bool dynamic_string::ensure_buf(uint len, bool preserve_contents) {
  uint buf_size_needed = len + 1;

  CRNLIB_ASSERT(buf_size_needed <= cUINT16_MAX);

  if (buf_size_needed <= cUINT16_MAX) {
    if (buf_size_needed > m_buf_size)
      expand_buf(buf_size_needed, preserve_contents);
  }

  return m_buf_size >= buf_size_needed;
}